

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_manager.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::tracker_manager::remove_request(tracker_manager *this,http_tracker_connection *c)

{
  shared_ptr<libtorrent::aux::http_tracker_connection> *psVar1;
  shared_ptr<libtorrent::aux::http_tracker_connection> *psVar2;
  _Map_pointer ppsVar3;
  _Elt_pointer psVar4;
  iterator __position;
  shared_ptr<libtorrent::aux::http_tracker_connection> *psVar5;
  long lVar6;
  _Elt_pointer psVar7;
  long lVar8;
  type conn;
  iterator local_58;
  iterator local_38;
  
  psVar1 = (this->m_http_conns).
           super__Vector_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->m_http_conns).
           super__Vector_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)psVar2 - (long)psVar1 >> 6;
  psVar5 = psVar1;
  if (0 < lVar6) {
    psVar5 = (shared_ptr<libtorrent::aux::http_tracker_connection> *)
             ((long)&(psVar1->
                     super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr + ((long)psVar2 - (long)psVar1 & 0xffffffffffffffc0U));
    lVar6 = lVar6 + 1;
    __position._M_current = psVar1 + 2;
    do {
      if (__position._M_current[-2].
          super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == c) {
        __position._M_current = __position._M_current + -2;
        goto LAB_0037dd2f;
      }
      if (__position._M_current[-1].
          super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == c) {
        __position._M_current = __position._M_current + -1;
        goto LAB_0037dd2f;
      }
      if (((__position._M_current)->
          super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr == c) goto LAB_0037dd2f;
      if (__position._M_current[1].
          super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == c) {
        __position._M_current = __position._M_current + 1;
        goto LAB_0037dd2f;
      }
      lVar6 = lVar6 + -1;
      __position._M_current = __position._M_current + 4;
    } while (1 < lVar6);
  }
  lVar6 = (long)psVar2 - (long)psVar5 >> 4;
  if (lVar6 == 1) {
LAB_0037dd13:
    __position._M_current = psVar5;
    if ((psVar5->
        super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr != c) {
      __position._M_current = psVar2;
    }
  }
  else if (lVar6 == 2) {
LAB_0037dd0a:
    __position._M_current = psVar5;
    if ((psVar5->
        super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr != c) {
      psVar5 = psVar5 + 1;
      goto LAB_0037dd13;
    }
  }
  else {
    __position._M_current = psVar2;
    if ((lVar6 == 3) &&
       (__position._M_current = psVar5,
       (psVar5->
       super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr != c)) {
      psVar5 = psVar5 + 1;
      goto LAB_0037dd0a;
    }
  }
LAB_0037dd2f:
  if (__position._M_current != psVar2) {
    ::std::
    vector<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
    ::_M_erase(&this->m_http_conns,__position);
    psVar7 = (this->m_queued).
             super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((this->m_queued).
        super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur == psVar7) {
      return;
    }
    local_58._M_cur =
         (_Elt_pointer)
         (psVar7->
         super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr;
    local_58._M_first =
         (_Elt_pointer)
         (psVar7->
         super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
    (psVar7->
    super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (psVar7->
    super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
         = (element_type *)0x0;
    ::std::
    deque<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
    ::pop_front(&this->m_queued);
    ::std::
    vector<std::shared_ptr<libtorrent::aux::http_tracker_connection>,std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>>>
    ::emplace_back<std::shared_ptr<libtorrent::aux::http_tracker_connection>>
              ((vector<std::shared_ptr<libtorrent::aux::http_tracker_connection>,std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>>>
                *)&this->m_http_conns,
               (shared_ptr<libtorrent::aux::http_tracker_connection> *)&local_58);
    (*(((this->m_http_conns).
        super__Vector_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].
        super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->super_tracker_connection).super_timeout_handler._vptr_timeout_handler[3])();
    ppsVar3 = (this->m_queued).
              super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    counters::set_value(this->m_stats_counters,0x122,
                        ((long)(this->m_queued).
                               super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_last -
                         (long)(this->m_queued).
                               super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                        ((long)(this->m_queued).
                               super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                         (long)(this->m_queued).
                               super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                        ((((ulong)((long)ppsVar3 -
                                  (long)(this->m_queued).
                                        super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
                                        ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1)
                        + (ulong)(ppsVar3 == (_Map_pointer)0x0)) * 0x20);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_first ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      return;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_first);
    return;
  }
  local_58._M_cur =
       (this->m_queued).
       super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_cur;
  psVar7 = (this->m_queued).
           super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
  local_58._M_node =
       (this->m_queued).
       super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_node;
  psVar4 = (this->m_queued).
           super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppsVar3 = (this->m_queued).
            super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  lVar6 = (long)psVar4 -
          (long)(this->m_queued).
                super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4;
  lVar8 = (long)(((long)psVar7 - (long)local_58._M_cur >> 4) + lVar6 +
                (((ulong)((long)ppsVar3 - (long)local_58._M_node) >> 3) -
                (ulong)(ppsVar3 != (_Map_pointer)0x0)) * 0x20) >> 2;
  if (0 < lVar8) {
    lVar8 = lVar8 + 1;
    do {
      if (((local_58._M_cur)->
          super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr == c) goto LAB_0037df6b;
      local_58._M_cur = local_58._M_cur + 1;
      if (local_58._M_cur == psVar7) {
        local_58._M_cur = local_58._M_node[1];
        local_58._M_node = local_58._M_node + 1;
        psVar7 = local_58._M_cur + 0x20;
      }
      if (((local_58._M_cur)->
          super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr == c) goto LAB_0037df6b;
      local_58._M_cur = local_58._M_cur + 1;
      if (local_58._M_cur == psVar7) {
        local_58._M_cur = local_58._M_node[1];
        local_58._M_node = local_58._M_node + 1;
        psVar7 = local_58._M_cur + 0x20;
      }
      if (((local_58._M_cur)->
          super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr == c) goto LAB_0037df6b;
      local_58._M_cur = local_58._M_cur + 1;
      if (local_58._M_cur == psVar7) {
        local_58._M_cur = local_58._M_node[1];
        local_58._M_node = local_58._M_node + 1;
        psVar7 = local_58._M_cur + 0x20;
      }
      if (((local_58._M_cur)->
          super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr == c) goto LAB_0037df6b;
      local_58._M_cur = local_58._M_cur + 1;
      if (local_58._M_cur == psVar7) {
        local_58._M_cur = local_58._M_node[1];
        local_58._M_node = local_58._M_node + 1;
        psVar7 = local_58._M_cur + 0x20;
      }
      lVar8 = lVar8 + -1;
    } while (1 < lVar8);
  }
  lVar6 = ((long)psVar7 - (long)local_58._M_cur >> 4) + lVar6 +
          (((ulong)((long)ppsVar3 - (long)local_58._M_node) >> 3) -
          (ulong)(ppsVar3 != (_Map_pointer)0x0)) * 0x20;
  if (lVar6 == 1) {
LAB_0037df60:
    if (((local_58._M_cur)->
        super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr == c) goto LAB_0037df6b;
  }
  else {
    if (lVar6 == 2) {
LAB_0037df4a:
      if (((local_58._M_cur)->
          super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr == c) goto LAB_0037df6b;
      local_58._M_cur = local_58._M_cur + 1;
      if (local_58._M_cur == psVar7) {
        local_58._M_cur = local_58._M_node[1];
        local_58._M_node = local_58._M_node + 1;
      }
      goto LAB_0037df60;
    }
    if (lVar6 == 3) {
      if (((local_58._M_cur)->
          super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr == c) goto LAB_0037df6b;
      local_58._M_cur = local_58._M_cur + 1;
      if (local_58._M_cur == psVar7) {
        local_58._M_cur = local_58._M_node[1];
        local_58._M_node = local_58._M_node + 1;
        psVar7 = local_58._M_cur + 0x20;
      }
      goto LAB_0037df4a;
    }
  }
  local_58._M_node = ppsVar3;
  local_58._M_cur = psVar4;
LAB_0037df6b:
  if (local_58._M_cur != psVar4) {
    local_58._M_first = *local_58._M_node;
    local_58._M_last = local_58._M_first + 0x20;
    ::std::
    deque<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
    ::_M_erase(&local_38,&this->m_queued,&local_58);
    ppsVar3 = (this->m_queued).
              super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    counters::set_value(this->m_stats_counters,0x122,
                        ((long)(this->m_queued).
                               super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_last -
                         (long)(this->m_queued).
                               super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                        ((long)(this->m_queued).
                               super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                         (long)(this->m_queued).
                               super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                        ((((ulong)((long)ppsVar3 -
                                  (long)(this->m_queued).
                                        super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
                                        ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1)
                        + (ulong)(ppsVar3 == (_Map_pointer)0x0)) * 0x20);
  }
  return;
}

Assistant:

void tracker_manager::remove_request(aux::http_tracker_connection const* c)
	{
		TORRENT_ASSERT(is_single_thread());
		auto const i = std::find_if(m_http_conns.begin(), m_http_conns.end()
			, [c] (std::shared_ptr<aux::http_tracker_connection> const& ptr) { return ptr.get() == c; });
		if (i != m_http_conns.end())
		{
			m_http_conns.erase(i);
			if (!m_queued.empty())
			{
				auto conn = std::move(m_queued.front());
				m_queued.pop_front();
				m_http_conns.push_back(std::move(conn));
				m_http_conns.back()->start();
				m_stats_counters.set_value(counters::num_queued_tracker_announces, std::int64_t(m_queued.size()));
			}
			return;
		}

		auto const j = std::find_if(m_queued.begin(), m_queued.end()
			, [c] (std::shared_ptr<aux::http_tracker_connection> const& ptr) { return ptr.get() == c; });
		if (j != m_queued.end())
		{
			m_queued.erase(j);
			m_stats_counters.set_value(counters::num_queued_tracker_announces, std::int64_t(m_queued.size()));
		}
	}